

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

Vector3D * __thiscall
CMU462::Application::getMouseProjection
          (Vector3D *__return_storage_ptr__,Application *this,double dist)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar8 [16];
  double dVar9;
  Vector4D ray_wor4;
  Matrix4x4 modelview_matrix;
  GLdouble modelview [16];
  GLdouble projection [16];
  Matrix4x4 projection_matrix;
  float local_360;
  float local_35c;
  float local_358;
  float fStack_354;
  undefined8 uStack_350;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  Vector4D local_2f8;
  Vector4D local_2d8;
  Matrix4x4 local_2b8;
  Matrix4x4 local_238;
  double local_1b8 [16];
  double local_138 [17];
  Matrix4x4 local_b0;
  
  local_308._8_4_ = in_XMM0_Dc;
  local_308._0_8_ = dist;
  local_308._12_4_ = in_XMM0_Dd;
  glGetDoublev(0xba7,local_138);
  Matrix4x4::Matrix4x4(&local_b0,local_138);
  glGetDoublev(0xba6,local_1b8);
  Matrix4x4::Matrix4x4(&local_238,local_1b8);
  uVar1 = this->screenH;
  local_2d8.x = (double)((this->mouseX + this->mouseX) / (float)this->screenW + -1.0);
  dVar3 = (double)((float)uVar1 - this->mouseY);
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  local_2d8.y = (dVar3 + dVar3) /
                ((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) + -1.0;
  local_2d8.z = -1.0;
  local_2d8.w = 1.0;
  Matrix4x4::inv(&local_2b8,&local_b0);
  Matrix4x4::operator*(&local_2b8,&local_2d8);
  local_2f8.z = -1.0;
  local_2f8.w = 0.0;
  local_358 = (float)(this->camera).nClip;
  fStack_354 = (float)(this->camera).fClip;
  uStack_350 = 0;
  (*__glewBindFramebuffer)(0x8ca8,this->frntface_fbo);
  glReadPixels((int)this->mouseX,(int)((float)this->screenH - this->mouseY),1,1,0x1902,0x1406,
               &local_35c);
  auVar6._4_4_ = fStack_354;
  auVar6._0_4_ = local_358;
  auVar6._8_8_ = uStack_350;
  local_318._4_12_ = auVar6._4_12_;
  local_348._4_4_ = fStack_354;
  local_348._0_4_ = fStack_354;
  local_348._8_4_ = fStack_354;
  local_348._12_4_ = fStack_354;
  local_318._0_4_ = (local_358 + local_358) * fStack_354;
  local_328._0_4_ = local_358 + fStack_354;
  local_328._4_12_ = local_318._4_12_;
  local_338._4_12_ = local_348._4_12_;
  local_338._0_4_ = fStack_354 - local_358;
  local_35c = (float)local_318._0_4_ /
              ((float)local_328._0_4_ - (local_35c + local_35c + -1.0) * (float)local_338._0_4_);
  (*__glewBindFramebuffer)(0x8ca8,this->backface_fbo);
  glReadPixels((int)this->mouseX,(int)((float)this->screenH - this->mouseY),1,1,0x1902,0x1406,
               &local_360);
  local_360 = (float)local_318._0_4_ /
              ((float)local_328._0_4_ - (local_360 + local_360 + -1.0) * (float)local_338._0_4_);
  (*__glewBindFramebuffer)(0x8ca8,0);
  bVar7 = true;
  if (local_358 < local_35c) {
    bVar7 = ((float)local_348._0_4_ <= local_35c || (float)local_348._0_4_ <= local_360) ||
            local_360 <= local_358;
  }
  Matrix4x4::operator*(&local_238,&local_2f8);
  dVar4 = (this->camera).pos.x;
  dVar5 = (this->camera).pos.y;
  dVar3 = (this->camera).pos.z;
  if ((ulong)ABS((double)local_308._0_8_) < 0x7ff0000000000000) {
    dVar9 = 1.0 / SQRT(local_2b8.entries[0].z * local_2b8.entries[0].z +
                       local_2b8.entries[0].x * local_2b8.entries[0].x +
                       local_2b8.entries[0].y * local_2b8.entries[0].y);
    local_2b8.entries[0].z = local_2b8.entries[0].z * dVar9;
    local_2b8.entries[0].x = local_2b8.entries[0].x * dVar9;
    local_2b8.entries[0].y = local_2b8.entries[0].y * dVar9;
  }
  else if (bVar7) {
    local_308._0_8_ =
         (-local_2b8.entries[0].x * dVar4 - dVar5 * local_2b8.entries[0].y) -
         dVar3 * local_2b8.entries[0].z;
  }
  else {
    local_308._0_8_ = (undefined8)((local_360 - local_35c) * 0.5 + local_35c);
  }
  dVar4 = dVar4 + (double)local_308._0_8_ * local_2b8.entries[0].x;
  dVar5 = dVar5 + (double)local_308._0_8_ * local_2b8.entries[0].y;
  auVar2._8_4_ = SUB84(dVar5,0);
  auVar2._0_8_ = dVar4;
  auVar2._12_4_ = (int)((ulong)dVar5 >> 0x20);
  __return_storage_ptr__->x = dVar4;
  __return_storage_ptr__->y = (double)auVar2._8_8_;
  __return_storage_ptr__->z = dVar3 + local_2b8.entries[0].z * (double)local_308._0_8_;
  return __return_storage_ptr__;
}

Assistant:

Vector3D Application::getMouseProjection(double dist) {
  // get projection matrix from OpenGL stack.
  GLdouble projection[16];
  glGetDoublev(GL_PROJECTION_MATRIX, projection);
  Matrix4x4 projection_matrix(projection);

  // get view matrix from OpenGL stack.
  GLdouble modelview[16];
  glGetDoublev(GL_MODELVIEW_MATRIX, modelview);
  Matrix4x4 modelview_matrix(modelview);

  // ray in clip coordinates
  double x = mouseX * 2 / screenW - 1;
  double y = screenH - mouseY;  // y is upside down
  y = y * 2 / screenH - 1;

  Vector4D ray_clip(x, y, -1.0, 1.0);
  // ray in eye coordinates
  Vector4D ray_eye = projection_matrix.inv() * ray_clip;

  // ray is into the screen and not a point.
  ray_eye.z = -1.0;
  ray_eye.w = 0.0;

  GLfloat z1, z2;
  const float zNear = camera.near_clip();
  const float zFar = camera.far_clip();
  glBindFramebuffer(GL_READ_FRAMEBUFFER, frntface_fbo);
  glReadPixels(mouseX, screenH-mouseY, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &z1);
  z1 = z1 * 2.f - 1.f;
  z1 = 2.f * zNear * zFar / (zFar + zNear - z1 * (zFar - zNear));
  glBindFramebuffer(GL_READ_FRAMEBUFFER, backface_fbo);
  glReadPixels(mouseX, screenH-mouseY, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &z2);
  z2 = z2 * 2.f - 1.f;
  z2 = 2.f * zNear * zFar / (zFar + zNear - z2 * (zFar - zNear));
  glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);

  bool invalid = (z1 <= zNear || z2 <= zNear || z1 >= zFar || z2 >= zFar);

  // ray in world coordinates
  Vector4D ray_wor4 = modelview_matrix * ray_eye;
  Vector3D ray_wor(ray_wor4.x, ray_wor4.y, ray_wor4.z);

  Vector3D ray_orig(camera.position());

  double t = dot(ray_orig, -ray_wor);
  if(std::isfinite(dist)) {
    // If a distance was given, use that instead
    ray_wor = ray_wor.unit();
    t = dist;
  } else if(!invalid) {
    // The current ray  is not a unit vector - it is normalized in z
    // so we can simply move along that (scaled) ray by the viewspace
    // z value
    t = z1 + (z2 - z1) / 2.f; // average of in/out depth
  }

  Vector3D intersect = ray_orig + t * ray_wor;

  return intersect;
}